

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_str.c
# Opt level: O3

adt_error_t adt_str_reserve(adt_str_t *self,int32_t s32NewLen)

{
  uint uVar1;
  uint8_t *__src;
  uint uVar2;
  adt_error_t aVar3;
  uint8_t *__dest;
  uint uVar4;
  
  aVar3 = '\x01';
  if (-1 < s32NewLen && self != (adt_str_t *)0x0) {
    uVar1 = self->s32Size;
    if ((int)uVar1 <= s32NewLen) {
      uVar4 = 0x7fffffff;
      if ((uint)s32NewLen < 0x7bffffff) {
        if ((uint)s32NewLen < 0x3ffffff) {
          if ((uint)s32NewLen < 0xffff) {
            uVar2 = 0x10;
            if (0x10 < (int)uVar1) {
              uVar2 = uVar1;
            }
            do {
              uVar4 = uVar2;
              uVar2 = uVar4 * 4;
            } while ((int)uVar4 <= s32NewLen);
          }
          else {
            uVar2 = 0x10000;
            if (0x10000 < (int)uVar1) {
              uVar2 = uVar1;
            }
            do {
              uVar4 = uVar2;
              uVar2 = uVar4 * 2;
            } while ((int)uVar4 <= s32NewLen);
          }
        }
        else {
          uVar4 = 0x4000000;
          if (0x4000000 < (int)uVar1) {
            uVar4 = uVar1;
          }
          uVar4 = ((s32NewLen - uVar4) + 0x4000000 & 0xfc000000) + uVar4;
        }
      }
      __dest = (uint8_t *)malloc((ulong)uVar4);
      if (__dest == (uint8_t *)0x0) {
        return '\x02';
      }
      __src = self->pAlloc;
      if (__src != (uint8_t *)0x0) {
        memcpy(__dest,__src,(long)self->s32Cur);
        free(__src);
      }
      self->pAlloc = __dest;
      self->s32Size = uVar4;
    }
    aVar3 = '\0';
  }
  return aVar3;
}

Assistant:

adt_error_t adt_str_reserve(adt_str_t *self, int32_t s32NewLen)
{
   adt_error_t retval = ADT_NO_ERROR;

   if ( (self == 0) || (s32NewLen < 0) )
   {
      retval = ADT_INVALID_ARGUMENT_ERROR;
   }
   else
   {
      s32NewLen++; //reserve 1 byte for null terminator
      if (self->s32Size < s32NewLen)
      {
         uint8_t *pStr;
         int32_t s32Size;

         s32Size = adt_str_calcSize(self->s32Size, s32NewLen);
         pStr = (uint8_t*) malloc(s32Size);
         if (pStr == 0)
         {
            retval = ADT_MEM_ERROR;
         }
         else
         {
            if(self->pAlloc != 0)
            {
               memcpy(pStr,self->pAlloc, self->s32Cur);
               free(self->pAlloc);
            }
            self->pAlloc = pStr;
            self->s32Size = s32Size;
         }
      }
   }
   return retval;
}